

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

const_iterator
mserialize::string_view::search
          (const_iterator first,const_iterator last,const_iterator s_first,const_iterator s_last)

{
  const_iterator s_it;
  const_iterator it;
  const_iterator s_last_local;
  const_iterator s_first_local;
  const_iterator last_local;
  const_iterator first_local;
  
  first_local = first;
  do {
    it = first_local;
    s_it = s_first;
    while( true ) {
      if (s_it == s_last) {
        return first_local;
      }
      if (it == last) {
        return last;
      }
      if (*it != *s_it) break;
      it = it + 1;
      s_it = s_it + 1;
    }
    first_local = first_local + 1;
  } while( true );
}

Assistant:

static const_iterator
  search(const_iterator first, const_iterator last, const_iterator s_first, const_iterator s_last)
  {
    for (; ; ++first)
    {
      const_iterator it = first;
      for (const_iterator s_it = s_first; ; ++it, ++s_it)
      {
        if (s_it == s_last) { return first; }

        if (it == last) { return last; }

        if (*it != *s_it) { break; }
      }
    }
  }